

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilsTests.cpp
# Opt level: O3

int testSpecDowngradePipeline(void)

{
  pointer pcVar1;
  TypeUnion TVar2;
  Pipeline *pPVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  StringFeatureType *pSVar7;
  Type *pTVar8;
  ImageFeatureType *pIVar9;
  VisionFeaturePrint *this;
  VisionFeaturePrint_Scene *this_00;
  ArrayFeatureType *pAVar10;
  GLMClassifier *this_01;
  Type *pTVar11;
  StringVector *pSVar12;
  Model *pMVar13;
  LogMessage *pLVar14;
  PipelineClassifier *pPVar15;
  ostream *poVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  Model spec;
  Model model;
  LogFinisher local_b1;
  undefined1 local_b0 [56];
  Model local_78;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_78);
  local_78.specificationversion_ = 7;
  if (local_78._oneof_case_[0] != 200) {
    CoreML::Specification::Model::clear_Type(&local_78);
    local_78._oneof_case_[0] = 200;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x20);
    CoreML::Specification::PipelineClassifier::PipelineClassifier(TVar2.pipelineclassifier_);
    local_78.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_78.Type_;
  pPVar3 = (local_78.Type_.pipelineclassifier_)->pipeline_;
  if (pPVar3 == (Pipeline *)0x0) {
    pPVar3 = (Pipeline *)operator_new(0x48);
    CoreML::Specification::Pipeline::Pipeline(pPVar3);
    (TVar2.pipelineclassifier_)->pipeline_ = pPVar3;
  }
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_78.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"image","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 4) {
    ((pFVar6->Type_).imagetype_)->width_ = 299;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 4;
    pIVar9 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar9);
    (pFVar6->Type_).imagetype_ = pIVar9;
    pFVar6 = pTVar5->type_;
    pIVar9->width_ = 299;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 4) {
    ((pFVar6->Type_).imagetype_)->height_ = 299;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 4;
    pIVar9 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar9);
    (pFVar6->Type_).imagetype_ = pIVar9;
    pFVar6 = pTVar5->type_;
    pIVar9->height_ = 299;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 4) {
    pIVar9 = (pFVar6->Type_).imagetype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 4;
    pIVar9 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar9);
    (pFVar6->Type_).imagetype_ = pIVar9;
  }
  pIVar9->colorspace_ = 0x1e;
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_78.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_78.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 3;
    pSVar7 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar7);
    (pFVar6->Type_).stringtype_ = pSVar7;
  }
  if (local_78.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_78.description_ = pMVar4;
  }
  pMVar4 = local_78.description_;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar4->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                     (&(pPVar3->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar8->specificationversion_ = 7;
  pMVar4 = pTVar8->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    pTVar8->description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"image","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 4) {
    ((pFVar6->Type_).imagetype_)->width_ = 299;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 4;
    pIVar9 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar9);
    (pFVar6->Type_).imagetype_ = pIVar9;
    pFVar6 = pTVar5->type_;
    pIVar9->width_ = 299;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 4) {
    ((pFVar6->Type_).imagetype_)->height_ = 299;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 4;
    pIVar9 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar9);
    (pFVar6->Type_).imagetype_ = pIVar9;
    pFVar6 = pTVar5->type_;
    pIVar9->height_ = 299;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 4) {
    pIVar9 = (pFVar6->Type_).imagetype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 4;
    pIVar9 = (ImageFeatureType *)operator_new(0x38);
    CoreML::Specification::ImageFeatureType::ImageFeatureType(pIVar9);
    (pFVar6->Type_).imagetype_ = pIVar9;
  }
  pIVar9->colorspace_ = 0x1e;
  pMVar4 = pTVar8->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    pTVar8->description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    ((pFVar6->Type_).multiarraytype_)->datatype_ = 0x10020;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
    pFVar6 = pTVar5->type_;
    pAVar10->datatype_ = 0x10020;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
  }
  iVar19 = (pAVar10->shape_).current_size_;
  if (iVar19 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar19 + 1);
    iVar19 = (pAVar10->shape_).current_size_;
  }
  (pAVar10->shape_).current_size_ = iVar19 + 1;
  ((pAVar10->shape_).rep_)->elements[iVar19] = 0x800;
  if (pTVar8->_oneof_case_[0] == 0x7d2) {
    this = (pTVar8->Type_).visionfeatureprint_;
  }
  else {
    CoreML::Specification::Model::clear_Type(pTVar8);
    pTVar8->_oneof_case_[0] = 0x7d2;
    this = (VisionFeaturePrint *)operator_new(0x20);
    CoreML::Specification::CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(this);
    (pTVar8->Type_).visionfeatureprint_ = this;
  }
  if (this->_oneof_case_[0] == 0x14) {
    this_00 = (this->VisionFeaturePrintType_).scene_;
  }
  else {
    CoreML::Specification::CoreMLModels::VisionFeaturePrint::clear_VisionFeaturePrintType(this);
    this->_oneof_case_[0] = 0x14;
    this_00 = (VisionFeaturePrint_Scene *)operator_new(0x18);
    CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::VisionFeaturePrint_Scene(this_00)
    ;
    (this->VisionFeaturePrintType_).scene_ = this_00;
  }
  this_00->version_ = 1;
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                     (&(pPVar3->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar8->specificationversion_ = 7;
  pMVar4 = pTVar8->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    pTVar8->description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"features","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    ((pFVar6->Type_).multiarraytype_)->datatype_ = 0x10020;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
    pFVar6 = pTVar5->type_;
    pAVar10->datatype_ = 0x10020;
    if (pFVar6 == (FeatureType *)0x0) {
      pFVar6 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar6);
      pTVar5->type_ = pFVar6;
    }
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar6->Type_).multiarraytype_ = pAVar10;
  }
  iVar19 = (pAVar10->shape_).current_size_;
  if (iVar19 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar19 + 1);
    iVar19 = (pAVar10->shape_).current_size_;
  }
  (pAVar10->shape_).current_size_ = iVar19 + 1;
  ((pAVar10->shape_).rep_)->elements[iVar19] = 0x800;
  pMVar4 = pTVar8->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    pTVar8->description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(pMVar4->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 3;
    pSVar7 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar7);
    (pFVar6->Type_).stringtype_ = pSVar7;
  }
  pMVar4 = pTVar8->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    pTVar8->description_ = pMVar4;
  }
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"classLabel","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar4->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (pTVar8->_oneof_case_[0] == 400) {
    this_01 = (pTVar8->Type_).glmclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(pTVar8);
    pTVar8->_oneof_case_[0] = 400;
    this_01 = (GLMClassifier *)operator_new(0x58);
    CoreML::Specification::GLMClassifier::GLMClassifier(this_01);
    (pTVar8->Type_).glmclassifier_ = this_01;
  }
  this_01->postevaluationtransform_ = 0;
  iVar19 = (this_01->offset_).current_size_;
  if (iVar19 == (this_01->offset_).total_size_) {
    google::protobuf::RepeatedField<double>::Reserve(&this_01->offset_,iVar19 + 1);
    iVar19 = (this_01->offset_).current_size_;
  }
  (this_01->offset_).current_size_ = iVar19 + 1;
  ((this_01->offset_).rep_)->elements[iVar19] = 0.0;
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                      (&(this_01->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
  iVar19 = (pTVar11->value_).current_size_;
  iVar18 = 0x800;
  do {
    if (iVar19 == (pTVar11->value_).total_size_) {
      google::protobuf::RepeatedField<double>::Reserve(&pTVar11->value_,iVar19 + 1);
      iVar19 = (pTVar11->value_).current_size_;
    }
    lVar17 = (long)iVar19;
    iVar19 = iVar19 + 1;
    (pTVar11->value_).current_size_ = iVar19;
    ((pTVar11->value_).rep_)->elements[lVar17] = 0.0;
    iVar18 = iVar18 + -1;
  } while (iVar18 != 0);
  if (this_01->_oneof_case_[0] == 100) {
    pSVar12 = (this_01->ClassLabels_).stringclasslabels_;
  }
  else {
    CoreML::Specification::GLMClassifier::clear_ClassLabels(this_01);
    this_01->_oneof_case_[0] = 100;
    pSVar12 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(pSVar12);
    (this_01->ClassLabels_).stringclasslabels_ = pSVar12;
  }
  CoreML::Specification::StringVector::add_vector(pSVar12,"cat");
  if (this_01->_oneof_case_[0] == 100) {
    pSVar12 = (this_01->ClassLabels_).stringclasslabels_;
  }
  else {
    CoreML::Specification::GLMClassifier::clear_ClassLabels(this_01);
    this_01->_oneof_case_[0] = 100;
    pSVar12 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(pSVar12);
    (this_01->ClassLabels_).stringclasslabels_ = pSVar12;
  }
  CoreML::Specification::StringVector::add_vector(pSVar12,"dog");
  CoreML::Model::Model(&local_48,&local_78);
  pMVar13 = CoreML::Model::getProto(&local_48);
  if (pMVar13->specificationversion_ == 3) {
    pMVar13 = CoreML::Model::getProto(&local_48);
    if (pMVar13->_oneof_case_[0] == 200) {
      pPVar15 = (pMVar13->Type_).pipelineclassifier_;
    }
    else {
      pPVar15 = CoreML::Specification::PipelineClassifier::default_instance();
    }
    pPVar3 = pPVar15->pipeline_;
    if (pPVar3 == (Pipeline *)0x0) {
      pPVar3 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
    }
    if ((pPVar3->models_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      pLVar14 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar14);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
    }
    if (*(int *)((long)((pPVar3->models_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18) == 3
       ) {
      pMVar13 = CoreML::Model::getProto(&local_48);
      if (pMVar13->_oneof_case_[0] == 200) {
        pPVar15 = (pMVar13->Type_).pipelineclassifier_;
      }
      else {
        pPVar15 = CoreML::Specification::PipelineClassifier::default_instance();
      }
      pPVar3 = pPVar15->pipeline_;
      if (pPVar3 == (Pipeline *)0x0) {
        pPVar3 = (Pipeline *)&CoreML::Specification::_Pipeline_default_instance_;
      }
      if ((pPVar3->models_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
      }
      iVar19 = 0;
      if (*(int *)(*(long *)((pPVar3->models_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18) == 1)
      goto LAB_001b816b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS11)"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UtilsTests.cpp"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,
                 "(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UtilsTests.cpp"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x49);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,
               "(model.getProto().specificationversion()) == (MLMODEL_SPECIFICATION_VERSION_IOS12)",
               0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  std::ostream::put((char)poVar16);
  iVar19 = 1;
  std::ostream::flush();
LAB_001b816b:
  CoreML::Model::~Model(&local_48);
  CoreML::Specification::Model::~Model(&local_78);
  return iVar19;
}

Assistant:

int testSpecDowngradePipeline() {

    int32_t latestVersion = MLMODEL_SPECIFICATION_VERSION;

    Specification::Model spec;
    spec.set_specificationversion(latestVersion);
    auto* pipeline = spec.mutable_pipelineclassifier()->mutable_pipeline();

    auto* input = spec.mutable_description()->add_input();
    input->set_name("image");
    input->mutable_type()->mutable_imagetype()->set_width(299);
    input->mutable_type()->mutable_imagetype()->set_height(299);
    input->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto* output = spec.mutable_description()->add_output();
    output->set_name("classLabel");
    output->mutable_type()->mutable_stringtype();

    spec.mutable_description()->set_predictedfeaturename("classLabel");

    // VisionFeaturePrint
    auto *featureModel = pipeline->add_models();
    featureModel->set_specificationversion(latestVersion);

    auto* featureInput = featureModel->mutable_description()->add_input();
    featureInput->set_name("image");
    featureInput->mutable_type()->mutable_imagetype()->set_width(299);
    featureInput->mutable_type()->mutable_imagetype()->set_height(299);
    featureInput->mutable_type()->mutable_imagetype()->set_colorspace(Specification::ImageFeatureType_ColorSpace_BGR);

    auto featureOutput = featureModel->mutable_description()->add_output();
    featureOutput->set_name("features");
    featureOutput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    featureOutput->mutable_type()->mutable_multiarraytype()->add_shape(2048);


    featureModel->mutable_visionfeatureprint()->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);

    // Logistic regression
    auto *classifierModel = pipeline->add_models();
    classifierModel->set_specificationversion(latestVersion);

    auto classifierInput = classifierModel->mutable_description()->add_input();
    classifierInput->set_name("features");
    classifierInput->mutable_type()->mutable_multiarraytype()->set_datatype(Specification::ArrayFeatureType::FLOAT32);
    classifierInput->mutable_type()->mutable_multiarraytype()->add_shape(2048);

    auto classifierOutput = classifierModel->mutable_description()->add_output();
    classifierOutput->set_name("classLabel");
    classifierOutput->mutable_type()->mutable_stringtype();
    classifierModel->mutable_description()->set_predictedfeaturename("classLabel");

    auto glm = classifierModel->mutable_glmclassifier();
    glm->set_postevaluationtransform(::CoreML::Specification::GLMClassifier_PostEvaluationTransform_Logit);
    glm->add_offset(0.0);
    auto weights = glm->add_weights();
    for (int i=0; i<2048; i++) { weights->add_value(0.0); }
    glm->mutable_stringclasslabels()->add_vector("cat");
    glm->mutable_stringclasslabels()->add_vector("dog");

    // Constructing an CoreML::Model should downgrade spec on load
    Model model(spec);

    // Top level should be IOS 12 because it contains vision feature print
    ML_ASSERT_EQ(model.getProto().specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // First model in pipeline is vision feature print and should have IOS12 spec version
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(0).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS12);

    // Second model is just a GLM which has support in IOS 11
    ML_ASSERT_EQ(model.getProto().pipelineclassifier().pipeline().models(1).specificationversion(), MLMODEL_SPECIFICATION_VERSION_IOS11);

    return 0;
}